

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.hpp
# Opt level: O0

vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
* __thiscall
crsGA::DefaultCrossoverPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>::crossover
          (vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
           *__return_storage_ptr__,
          DefaultCrossoverPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_> *this,
          vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
          *parents)

{
  result_type_conflict rVar1;
  const_reference this_00;
  size_t sVar2;
  reference pvVar3;
  GenesArray *pGVar4;
  iterator __first2;
  __normal_iterator<Gen_*,_std::vector<Gen,_std::allocator<Gen>_>_> local_27a0;
  __normal_iterator<Gen_*,_std::vector<Gen,_std::allocator<Gen>_>_> local_2798;
  __normal_iterator<Gen_*,_std::vector<Gen,_std::allocator<Gen>_>_> local_2790;
  Gen *local_2788;
  Gen *local_2780;
  __normal_iterator<Gen_*,_std::vector<Gen,_std::allocator<Gen>_>_> local_2778;
  __normal_iterator<Gen_*,_std::vector<Gen,_std::allocator<Gen>_>_> local_2770;
  __normal_iterator<Gen_*,_std::vector<Gen,_std::allocator<Gen>_>_> local_2768;
  result_type local_2760;
  result_type crossOverPoint;
  uniform_int_distribution<unsigned_long> uni;
  mt19937 rng;
  undefined1 local_13b0 [8];
  random_device rd;
  vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  *parents_local;
  DefaultCrossoverPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_> *this_local;
  vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  *children;
  
  rd.field_0._M_mt._M_p._7_1_ = 0;
  std::
  vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  ::vector(__return_storage_ptr__,parents);
  std::random_device::random_device((random_device *)local_13b0);
  rVar1 = std::random_device::operator()((random_device *)local_13b0);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)&uni._M_param._M_b,(ulong)rVar1);
  this_00 = std::
            vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
            ::operator[](parents,0);
  sVar2 = Chromosome<Gen,_ComputeFitness>::getNumGenes(this_00);
  std::uniform_int_distribution<unsigned_long>::uniform_int_distribution
            ((uniform_int_distribution<unsigned_long> *)&crossOverPoint,0,sVar2 - 1);
  local_2760 = std::uniform_int_distribution<unsigned_long>::operator()
                         ((uniform_int_distribution<unsigned_long> *)&crossOverPoint,
                          (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                           *)&uni._M_param._M_b);
  pvVar3 = std::
           vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
           ::operator[](__return_storage_ptr__,0);
  pGVar4 = Chromosome<Gen,_ComputeFitness>::getGenes(pvVar3);
  local_2768._M_current = (Gen *)std::vector<Gen,_std::allocator<Gen>_>::begin(pGVar4);
  pvVar3 = std::
           vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
           ::operator[](__return_storage_ptr__,0);
  pGVar4 = Chromosome<Gen,_ComputeFitness>::getGenes(pvVar3);
  local_2778._M_current = (Gen *)std::vector<Gen,_std::allocator<Gen>_>::begin(pGVar4);
  local_2770 = __gnu_cxx::__normal_iterator<Gen_*,_std::vector<Gen,_std::allocator<Gen>_>_>::
               operator+(&local_2778,local_2760);
  pvVar3 = std::
           vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
           ::operator[](__return_storage_ptr__,1);
  pGVar4 = Chromosome<Gen,_ComputeFitness>::getGenes(pvVar3);
  local_2780 = (Gen *)std::vector<Gen,_std::allocator<Gen>_>::begin(pGVar4);
  local_2788 = (Gen *)std::
                      swap_ranges<__gnu_cxx::__normal_iterator<Gen*,std::vector<Gen,std::allocator<Gen>>>,__gnu_cxx::__normal_iterator<Gen*,std::vector<Gen,std::allocator<Gen>>>>
                                (local_2768,local_2770,
                                 (__normal_iterator<Gen_*,_std::vector<Gen,_std::allocator<Gen>_>_>)
                                 local_2780);
  local_2760 = std::uniform_int_distribution<unsigned_long>::operator()
                         ((uniform_int_distribution<unsigned_long> *)&crossOverPoint,
                          (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                           *)&uni._M_param._M_b);
  pvVar3 = std::
           vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
           ::operator[](__return_storage_ptr__,1);
  pGVar4 = Chromosome<Gen,_ComputeFitness>::getGenes(pvVar3);
  local_2790._M_current = (Gen *)std::vector<Gen,_std::allocator<Gen>_>::begin(pGVar4);
  pvVar3 = std::
           vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
           ::operator[](__return_storage_ptr__,1);
  pGVar4 = Chromosome<Gen,_ComputeFitness>::getGenes(pvVar3);
  local_27a0._M_current = (Gen *)std::vector<Gen,_std::allocator<Gen>_>::begin(pGVar4);
  local_2798 = __gnu_cxx::__normal_iterator<Gen_*,_std::vector<Gen,_std::allocator<Gen>_>_>::
               operator+(&local_27a0,local_2760);
  pvVar3 = std::
           vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
           ::operator[](__return_storage_ptr__,0);
  pGVar4 = Chromosome<Gen,_ComputeFitness>::getGenes(pvVar3);
  __first2 = std::vector<Gen,_std::allocator<Gen>_>::begin(pGVar4);
  std::
  swap_ranges<__gnu_cxx::__normal_iterator<Gen*,std::vector<Gen,std::allocator<Gen>>>,__gnu_cxx::__normal_iterator<Gen*,std::vector<Gen,std::allocator<Gen>>>>
            (local_2790,local_2798,
             (__normal_iterator<Gen_*,_std::vector<Gen,_std::allocator<Gen>_>_>)__first2._M_current)
  ;
  rd.field_0._M_mt._M_p._7_1_ = 1;
  std::random_device::~random_device((random_device *)local_13b0);
  if ((rd.field_0._M_mt._M_p._7_1_ & 1) == 0) {
    std::
    vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<ChromosomeT> crossover(const std::vector<ChromosomeT> &parents) const
    {
        std::vector<ChromosomeT> children(parents);
        //Select a random crossover point
        std::random_device rd;                                                       // used once to initialise (seed) engine
        std::mt19937 rng(rd());                                                      // random-number engine used (Mersenne-Twister in this case)
        std::uniform_int_distribution<size_t> uni(0u, parents[0].getNumGenes() - 1); // guaranteed unbiased
        auto crossOverPoint = uni(rng);
        std::swap_ranges(children[0].getGenes().begin(),
                         children[0].getGenes().begin() + crossOverPoint,
                         children[1].getGenes().begin());
        crossOverPoint = uni(rng);
        std::swap_ranges(children[1].getGenes().begin(),
                         children[1].getGenes().begin() + crossOverPoint,
                         children[0].getGenes().begin());
        return children;
    }